

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

int Fraig_CheckTfi2(Fraig_Man_t *pMan,Fraig_Node_t *pOld,Fraig_Node_t *pNew)

{
  int iVar1;
  int iVar2;
  Fraig_NodeVec_t *p;
  
  p = Fraig_DfsOne(pMan,pNew,1);
  iVar2 = pOld->TravId;
  iVar1 = pMan->nTravIds;
  Fraig_NodeVecFree(p);
  return (int)(iVar2 == iVar1);
}

Assistant:

int Fraig_CheckTfi2( Fraig_Man_t * pMan, Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    Fraig_NodeVec_t * vNodes;
    int RetValue;
    vNodes = Fraig_DfsOne( pMan, pNew, 1 );
    RetValue = (pOld->TravId == pMan->nTravIds);
    Fraig_NodeVecFree( vNodes );
    return RetValue;
}